

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rehash.cpp
# Opt level: O0

bool Jupiter::removeOnRehash(OnRehashFunctionType in_function)

{
  bool bVar1;
  reference ppRVar2;
  const_iterator local_30;
  _Self local_28;
  _Self local_20;
  iterator node;
  OnRehashFunctionType in_function_local;
  
  node._M_node = (_List_node_base *)in_function;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<RehashFunction_*,_std::allocator<RehashFunction_*>_>::begin
                 (&o_rehash_functions_abi_cxx11_);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<RehashFunction_*,_std::allocator<RehashFunction_*>_>::end
                   (&o_rehash_functions_abi_cxx11_);
    bVar1 = std::operator==(&local_20,&local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    ppRVar2 = std::_List_iterator<RehashFunction_*>::operator*(&local_20);
    if ((_List_node_base *)(*ppRVar2)->m_function == node._M_node) break;
    std::_List_iterator<RehashFunction_*>::operator++(&local_20);
  }
  ppRVar2 = std::_List_iterator<RehashFunction_*>::operator*(&local_20);
  if (*ppRVar2 != (RehashFunction *)0x0) {
    (*((*ppRVar2)->super_Rehashable)._vptr_Rehashable[3])();
  }
  std::_List_const_iterator<RehashFunction_*>::_List_const_iterator(&local_30,&local_20);
  std::__cxx11::list<RehashFunction_*,_std::allocator<RehashFunction_*>_>::erase
            (&o_rehash_functions_abi_cxx11_,local_30);
  return true;
}

Assistant:

bool Jupiter::removeOnRehash(OnRehashFunctionType in_function)
{
	for (auto node = o_rehash_functions.begin(); node != o_rehash_functions.end(); ++node)
	{
		if ((*node)->m_function == in_function)
		{
			delete *node;
			o_rehash_functions.erase(node);
			return true;
		}
	}

	return false;
}